

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestComparisonsF<Counter<unsigned_long,48u>>(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  bVar7 = false;
  uVar1 = 0;
  do {
    uVar3 = uVar1 ^ 0xffffffffffff;
    uVar2 = uVar1 + 1;
    iVar6 = 1000;
    uVar4 = 0;
    uVar5 = uVar2;
    do {
      if (uVar3 - uVar4 == 0) {
        return bVar7;
      }
      if (uVar3 - uVar5 == 0) {
        return bVar7;
      }
      if (uVar4 - uVar5 == 0) {
        return bVar7;
      }
      if ((uVar3 - uVar4 & 0x800000000000) == 0) {
        return bVar7;
      }
      if ((uVar3 - uVar5 & 0x800000000000) == 0) {
        return bVar7;
      }
      if ((uVar4 - uVar5 & 0x800000000000) == 0) {
        return bVar7;
      }
      if ((uVar4 - uVar3 & 0x800000000000) != 0) {
        return bVar7;
      }
      if ((uVar5 - uVar3 & 0x800000000000) != 0) {
        return bVar7;
      }
      if ((uVar5 - uVar4 & 0x800000000000) != 0) {
        return bVar7;
      }
      uVar3 = uVar3 + 1 & 0xffffffffffff;
      uVar4 = uVar4 + 1 & 0xffffffffffff;
      uVar5 = uVar5 + 1 & 0xffffffffffff;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    iVar6 = 2000;
    do {
      if (uVar3 - uVar4 == 0) {
        return bVar7;
      }
      if (uVar3 - uVar5 == 0) {
        return bVar7;
      }
      if (uVar4 - uVar5 == 0) {
        return bVar7;
      }
      if ((uVar3 - uVar4 & 0x800000000000) == 0) {
        return bVar7;
      }
      if ((uVar3 - uVar5 & 0x800000000000) == 0) {
        return bVar7;
      }
      if ((uVar4 - uVar5 & 0x800000000000) == 0) {
        return bVar7;
      }
      if ((uVar4 - uVar3 & 0x800000000000) != 0) {
        return bVar7;
      }
      if ((uVar5 - uVar3 & 0x800000000000) != 0) {
        return bVar7;
      }
      if ((uVar5 - uVar4 & 0x800000000000) != 0) {
        return bVar7;
      }
      uVar3 = uVar3 + 0xffffffffffff & 0xffffffffffff;
      uVar4 = uVar4 + 0xffffffffffff & 0xffffffffffff;
      uVar5 = uVar5 + 0xffffffffffff & 0xffffffffffff;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    bVar7 = 1 < uVar1;
    uVar1 = uVar2;
    if (uVar2 == 3) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}